

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cc
# Opt level: O2

bool __thiscall
draco::Metadata::AddSubMetadata
          (Metadata *this,string *name,
          unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_> *sub_metadata)

{
  iterator iVar1;
  __uniq_ptr_impl<draco::Metadata,_std::default_delete<draco::Metadata>_> *this_00;
  _Rb_tree_header *p_Var2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
          ::find(&(this->sub_metadatas_)._M_t,name);
  p_Var2 = &(this->sub_metadatas_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node == p_Var2) {
    this_00 = (__uniq_ptr_impl<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<draco::Metadata,_std::default_delete<draco::Metadata>_>_>_>_>
              ::operator[](&this->sub_metadatas_,name);
    std::__uniq_ptr_impl<draco::Metadata,_std::default_delete<draco::Metadata>_>::operator=
              (this_00,(__uniq_ptr_impl<draco::Metadata,_std::default_delete<draco::Metadata>_> *)
                       sub_metadata);
  }
  return (_Rb_tree_header *)iVar1._M_node == p_Var2;
}

Assistant:

bool Metadata::AddSubMetadata(const std::string &name,
                              std::unique_ptr<Metadata> sub_metadata) {
  auto sub_ptr = sub_metadatas_.find(name);
  // Avoid accidentally writing over a sub-metadata with the same name.
  if (sub_ptr != sub_metadatas_.end()) {
    return false;
  }
  sub_metadatas_[name] = std::move(sub_metadata);
  return true;
}